

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TZGNCore::getDisplayName
          (TZGNCore *this,TimeZone *tz,UTimeZoneGenericNameType type,UDate date,UnicodeString *name)

{
  UBool UVar1;
  ConstChar16Ptr local_e0;
  UnicodeString local_d8;
  UChar *local_98;
  UChar *tzCanonicalID_1;
  ConstChar16Ptr local_80;
  UnicodeString local_78;
  UChar *local_38;
  UChar *tzCanonicalID;
  UnicodeString *name_local;
  UDate date_local;
  TimeZone *pTStack_18;
  UTimeZoneGenericNameType type_local;
  TimeZone *tz_local;
  TZGNCore *this_local;
  
  tzCanonicalID = (UChar *)name;
  name_local = (UnicodeString *)date;
  date_local._4_4_ = type;
  pTStack_18 = tz;
  tz_local = (TimeZone *)this;
  UnicodeString::setToBogus(name);
  if (date_local._4_4_ == UTZGNM_LOCATION) {
    local_38 = ZoneMeta::getCanonicalCLDRID(pTStack_18);
    if (local_38 != (UChar *)0x0) {
      ConstChar16Ptr::ConstChar16Ptr(&local_80,local_38);
      UnicodeString::UnicodeString(&local_78,'\x01',&local_80,-1);
      getGenericLocationName(this,&local_78,(UnicodeString *)tzCanonicalID);
      UnicodeString::~UnicodeString(&local_78);
      ConstChar16Ptr::~ConstChar16Ptr(&local_80);
    }
  }
  else if ((date_local._4_4_ == UTZGNM_LONG) || (date_local._4_4_ == UTZGNM_SHORT)) {
    formatGenericNonLocationName
              (this,pTStack_18,date_local._4_4_,(UDate)name_local,(UnicodeString *)tzCanonicalID);
    UVar1 = UnicodeString::isEmpty((UnicodeString *)tzCanonicalID);
    if ((UVar1 != '\0') &&
       (local_98 = ZoneMeta::getCanonicalCLDRID(pTStack_18), local_98 != (UChar *)0x0)) {
      ConstChar16Ptr::ConstChar16Ptr(&local_e0,local_98);
      UnicodeString::UnicodeString(&local_d8,'\x01',&local_e0,-1);
      getGenericLocationName(this,&local_d8,(UnicodeString *)tzCanonicalID);
      UnicodeString::~UnicodeString(&local_d8);
      ConstChar16Ptr::~ConstChar16Ptr(&local_e0);
    }
  }
  return (UnicodeString *)tzCanonicalID;
}

Assistant:

UnicodeString&
TZGNCore::getDisplayName(const TimeZone& tz, UTimeZoneGenericNameType type, UDate date, UnicodeString& name) const {
    name.setToBogus();
    switch (type) {
    case UTZGNM_LOCATION:
        {
            const UChar* tzCanonicalID = ZoneMeta::getCanonicalCLDRID(tz);
            if (tzCanonicalID != NULL) {
                getGenericLocationName(UnicodeString(TRUE, tzCanonicalID, -1), name);
            }
        }
        break;
    case UTZGNM_LONG:
    case UTZGNM_SHORT:
        formatGenericNonLocationName(tz, type, date, name);
        if (name.isEmpty()) {
            const UChar* tzCanonicalID = ZoneMeta::getCanonicalCLDRID(tz);
            if (tzCanonicalID != NULL) {
                getGenericLocationName(UnicodeString(TRUE, tzCanonicalID, -1), name);
            }
        }
        break;
    default:
        break;
    }
    return name;
}